

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_free(REF_GRID ref_grid)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong unaff_R15;
  
  if (ref_grid == (REF_GRID)0x0) {
    return 2;
  }
  if (ref_grid->interp != (REF_INTERP)0x0) {
    uVar1 = ref_grid_free(ref_grid->interp->from_grid);
    unaff_R15 = (ulong)uVar1;
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",199,
             "ref_grid_free",unaff_R15,"free cached background grid");
      return uVar1;
    }
    uVar1 = ref_interp_free(ref_grid->interp);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",200,
             "ref_grid_free",(ulong)uVar1,"interp free");
      unaff_R15 = (ulong)uVar1;
    }
    if (uVar1 != 0) {
      return (REF_STATUS)unaff_R15;
    }
  }
  uVar1 = ref_adapt_free(ref_grid->adapt);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcb,
           "ref_grid_free",(ulong)uVar1,"adapt free");
    unaff_R15 = (ulong)uVar1;
  }
  uVar2 = (uint)unaff_R15;
  if (uVar1 == 0) {
    uVar1 = ref_gather_free(ref_grid->gather);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcc,
             "ref_grid_free",(ulong)uVar1,"gather free");
      unaff_R15 = (ulong)uVar1;
    }
    uVar2 = (uint)unaff_R15;
    if (uVar1 == 0) {
      uVar1 = ref_geom_free(ref_grid->geom);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcd
               ,"ref_grid_free",(ulong)uVar1,"geom free");
        unaff_R15 = (ulong)uVar1;
      }
      uVar2 = (uint)unaff_R15;
      if (uVar1 == 0) {
        lVar3 = 2;
        do {
          uVar1 = ref_cell_free(ref_grid->cell[lVar3 + -2]);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xd0,"ref_grid_free",(ulong)uVar1,"cell free");
            unaff_R15 = (ulong)uVar1;
          }
          if (uVar1 != 0) {
            return (REF_STATUS)unaff_R15;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x12);
        uVar2 = ref_node_free(ref_grid->node);
        if (uVar2 == 0) {
          uVar2 = ref_mpi_free(ref_grid->mpi);
          if (uVar2 == 0) {
            free(ref_grid);
            uVar2 = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xd4,"ref_grid_free",(ulong)uVar2,"mpi free");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0xd3,"ref_grid_free",(ulong)uVar2,"node free");
        }
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_grid_free(REF_GRID ref_grid) {
  REF_INT group;
  REF_CELL ref_cell;

  if (NULL == (void *)ref_grid) return REF_NULL;

  if (NULL != (void *)ref_grid_interp(ref_grid)) {
    RSS(ref_grid_free(ref_interp_from_grid(ref_grid_interp(ref_grid))),
        "free cached background grid");
    RSS(ref_interp_free(ref_grid->interp), "interp free");
  }

  RSS(ref_adapt_free(ref_grid->adapt), "adapt free");
  RSS(ref_gather_free(ref_grid_gather(ref_grid)), "gather free");
  RSS(ref_geom_free(ref_grid_geom(ref_grid)), "geom free");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_free(ref_cell), "cell free");
  }

  RSS(ref_node_free(ref_grid_node(ref_grid)), "node free");
  RSS(ref_mpi_free(ref_grid_mpi(ref_grid)), "mpi free");

  ref_free(ref_grid);
  return REF_SUCCESS;
}